

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  uchar c;
  uint in_EAX;
  uint uVar1;
  uint extraout_EAX;
  ulong uVar2;
  ucvector text;
  
  text.data = (uchar *)0x0;
  text.size = 0;
  text.allocsize = 0;
  uVar2 = 0xffffffffffffffb0;
  while( true ) {
    c = keyword[uVar2 + 0x50];
    uVar1 = CONCAT31((int3)(in_EAX >> 8),c);
    if (c == '\0') break;
    in_EAX = ucvector_push_back(&text,c);
    uVar2 = uVar2 + 1;
  }
  if (0xffffffffffffffb0 < uVar2) {
    ucvector_push_back(&text,'\0');
    for (; *textstring != '\0'; textstring = (char *)((uchar *)textstring + 1)) {
      ucvector_push_back(&text,*textstring);
    }
    addChunk(out,"tEXt",text.data,text.size);
    ucvector_cleanup(&text);
    uVar1 = extraout_EAX;
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring)
{
  unsigned error = 0;
  size_t i;
  ucvector text;
  ucvector_init(&text);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&text, 0); /*0 termination char*/
  for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&text, (unsigned char)textstring[i]);
  error = addChunk(out, "tEXt", text.data, text.size);
  ucvector_cleanup(&text);

  return error;
}